

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedMAAStarPlanner.cpp
# Opt level: O0

void __thiscall
GeneralizedMAAStarPlanner::SelectKBestPoliciesToProcessFurther
          (GeneralizedMAAStarPlanner *this,
          shared_ptr<PartialPolicyPoolInterface> *poolOfNextPolicies,bool are_LBs,double bestLB,
          size_t k)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  type pPVar4;
  undefined4 extraout_var;
  type pPVar5;
  type pPVar6;
  type pPVar7;
  undefined4 extraout_var_00;
  ulong in_RCX;
  byte in_DL;
  shared_ptr<PartialPolicyPoolInterface> *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar8;
  PartialPolicyPoolItemInterface_sharedPtr best_ppi;
  size_t nr_done;
  PartialPolicyPoolInterface_sharedPtr pp_new;
  shared_ptr<PartialPolicyPoolItemInterface> *in_stack_fffffffffffffee8;
  undefined1 *puVar9;
  shared_ptr<PartialPolicyPoolItemInterface> *in_stack_fffffffffffffef0;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  shared_ptr<PartialPolicyPoolItemInterface> local_70;
  ulong local_60;
  shared_ptr<PartialPolicyPoolInterface> local_58 [2];
  undefined1 local_38 [16];
  ulong local_28;
  double local_20;
  byte local_11;
  shared_ptr<PartialPolicyPoolInterface> *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if (local_11 == 0) {
    local_28 = in_RCX;
    local_20 = in_XMM0_Qa;
    dVar8 = (double)(**(code **)(*in_RDI + 0x28))(local_58);
    local_60 = 0;
    while( true ) {
      pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_10);
      iVar2 = (*pPVar4->_vptr_PartialPolicyPoolInterface[0xb])();
      if (CONCAT44(extraout_var,iVar2) == 0) break;
      pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_10);
      (*pPVar4->_vptr_PartialPolicyPoolInterface[6])(&local_70);
      pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_10);
      (*pPVar4->_vptr_PartialPolicyPoolInterface[7])();
      if (local_60 < local_28) {
        pPVar5 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(&local_70);
        (*pPVar5->_vptr_PartialPolicyPoolItemInterface[3])();
        bVar1 = local_20 <= dVar8;
        dVar8 = local_20;
        if (bVar1) {
          pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_58);
          boost::shared_ptr<PartialPolicyPoolItemInterface>::shared_ptr
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          (*pPVar4->_vptr_PartialPolicyPoolInterface[8])(pPVar4,local_80);
          boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
                    ((shared_ptr<PartialPolicyPoolItemInterface> *)0x96221c);
        }
      }
      local_60 = local_60 + 1;
      boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
                ((shared_ptr<PartialPolicyPoolItemInterface> *)0x962262);
    }
    pPVar6 = boost::shared_ptr<PartialPolicyPoolInterface>::operator*(local_58);
    pPVar7 = boost::shared_ptr<PartialPolicyPoolInterface>::operator*(local_10);
    (*pPVar7->_vptr_PartialPolicyPoolInterface[2])(pPVar7,pPVar6);
    while( true ) {
      pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_58);
      iVar2 = (*pPVar4->_vptr_PartialPolicyPoolInterface[0xb])();
      if (CONCAT44(extraout_var_00,iVar2) == 0) break;
      pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_58);
      puVar9 = local_90;
      boost::shared_ptr<PartialPolicyPoolItemInterface>::shared_ptr
                ((shared_ptr<PartialPolicyPoolItemInterface> *)0x962311);
      (*pPVar4->_vptr_PartialPolicyPoolInterface[5])(pPVar4,puVar9);
      boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
                ((shared_ptr<PartialPolicyPoolItemInterface> *)0x962332);
    }
    boost::shared_ptr<PartialPolicyPoolInterface>::~shared_ptr
              ((shared_ptr<PartialPolicyPoolInterface> *)0x962364);
  }
  else {
    while( true ) {
      boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_10);
      sVar3 = PartialPolicyPoolInterface::Empty((PartialPolicyPoolInterface *)0x962018);
      if (sVar3 != 0) break;
      pPVar4 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_10);
      boost::shared_ptr<PartialPolicyPoolItemInterface>::shared_ptr
                ((shared_ptr<PartialPolicyPoolItemInterface> *)0x96204b);
      (*pPVar4->_vptr_PartialPolicyPoolInterface[5])(pPVar4,local_38);
      boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
                ((shared_ptr<PartialPolicyPoolItemInterface> *)0x96206d);
    }
  }
  return;
}

Assistant:

void 
GeneralizedMAAStarPlanner::SelectKBestPoliciesToProcessFurther(
    const boost::shared_ptr<PartialPolicyPoolInterface> &poolOfNextPolicies, bool are_LBs,
    double bestLB, size_t k)
{
    if(are_LBs)
    {
        //if all policies are full policies, we don't return any
        //of them (these need not be expanded further)
        while(!poolOfNextPolicies->Empty())
            poolOfNextPolicies->Pop();
        return;
    }
    PartialPolicyPoolInterface_sharedPtr pp_new = NewPP();
    
    size_t nr_done = 0;
    while(poolOfNextPolicies->Size() > 0 ) // && nr_done < k) 
    {
        PartialPolicyPoolItemInterface_sharedPtr best_ppi = poolOfNextPolicies->GetBestRanked();
        poolOfNextPolicies->PopBestRanked();
        if(nr_done >= k || best_ppi->GetValue() < bestLB)
        {
            //we do not want this policy, so discard it:
//            delete best_ppi;
        }
        else
        {
            //we do want this policy, so store it:
            pp_new->Insert(best_ppi);
        }
        nr_done++;
    }
    //done: - free the memory of the policies in poolOfNextPolicies
    //that we will not consider further!

    *poolOfNextPolicies = *pp_new;
    //remove elements from pp_new before delete! (otherwise they will be deleted    //with them) and we get a segfault later on...
    while(pp_new->Size() > 0)
        pp_new->Pop();
    
//    delete pp_new;

}